

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::RunTest(cmCTest *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *argv,string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmDuration cVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *env;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> uVar3;
  cmCTest *pcVar4;
  undefined8 __p;
  StdioConfiguration __p_00;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  string *file2;
  cmUVProcessChainBuilder *this_00;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  uv_stream_t *stream;
  ulong uVar9;
  Status *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar10;
  bool bVar11;
  cmDuration cVar12;
  cmProcessOutput processOutput;
  string *output_local;
  cmDuration local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_438;
  allocator<char> local_429;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  cmUVProcessChain chain;
  vector<char,_std::allocator<char>_> tempOutput;
  _Any_data __tmp;
  uv_loop_t *local_3c8;
  cmCTest *local_3c0;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  ostream *log_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  cmCTest inst;
  uv_pipe_ptr outputStream;
  _Vector_base<char,_std::allocator<char>_> local_340;
  ostringstream cmCTestLog_msg;
  cmUVProcessChainBuilder builder;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar11 = false;
  }
  else {
    bVar11 = (environment->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (environment->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  output_local = output;
  local_438 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)testTimeOut.__r;
  log_local = log;
  cVar12 = GetRemainingTimeAllowed(this);
  local_440.__r =
       (rep_conflict)
       (~-(ulong)(cVar12.__r != 10000000.0) & (ulong)cVar12.__r |
       (ulong)(cVar12.__r + -120.0) & -(ulong)(cVar12.__r != 10000000.0));
  cVar12.__r = (((this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TimeOut).__r;
  if ((0.0 < cVar12.__r) && (cVar12.__r < local_440.__r)) {
    local_440.__r = cVar12.__r;
  }
  cVar12.__r = local_440.__r;
  if (0.0 < (double)local_438) {
    cVar2 = GetRemainingTimeAllowed(this);
    if ((double)local_438 < cVar2.__r) {
      local_440.__r = (rep_conflict)local_438;
      cVar12.__r = (rep_conflict)local_438;
    }
  }
  if (cVar12.__r <= 0.0) {
    local_440.__r = 1.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Test timeout computed to be: ");
  local_438 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_440.__r;
  if ((local_440.__r != 10000000.0) || (NAN(local_440.__r))) {
    uVar7 = cmDurationTo<unsigned_int>(&local_440);
    std::__cxx11::to_string((string *)&builder,uVar7);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&builder,"infinite",&local_429);
  }
  poVar8 = std::operator<<(poVar8,(string *)&builder);
  std::operator<<(poVar8,"\n");
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0x4cd,(char *)builder.Stdio._M_elems[0],false);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  psVar10 = (argv->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  file2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar5 = cmsys::SystemTools::SameFile(psVar10,file2);
  local_3c8 = (uv_loop_t *)retVal;
  local_3c0 = this;
  if ((bVar5) &&
     (((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ForceNewCTestProcess == false
     )) {
    cmCTest(&inst);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)inst.Impl._M_t.
                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 8));
    *(rep_conflict *)
     ((long)inst.Impl._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x3aa0) = local_440.__r;
    local_438 = environment;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    *(ostringstream **)
     ((long)inst.Impl._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x3b48) =
         (ostringstream *)&cmCTestLog_msg;
    *(ostringstream **)
     ((long)inst.Impl._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x3b50) =
         (ostringstream *)&cmCTestLog_msg;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar1 = (argv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (argv->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
      bVar5 = std::operator==(__lhs,"--build-generator");
      if (bVar5) {
        if (((local_440.__r != 10000000.0) || (NAN(local_440.__r))) && (0.0 < local_440.__r)) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[15]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                     (char (*) [15])"--test-timeout");
          uVar7 = cmDurationTo<unsigned_int>(&local_440);
          std::__cxx11::to_string((string *)&builder,uVar7);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder);
          std::__cxx11::string::~string((string *)&builder);
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,__lhs);
    }
    if (log_local != (ostream *)0x0) {
      poVar8 = std::operator<<(log_local,"* Run internal CTest");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    pcVar4 = local_3c0;
    env = local_438;
    tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    if (bVar11) {
      std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      __p_00 = builder.Stdio._M_elems[0];
      builder.Stdio._M_elems[0].Type = None;
      builder.Stdio._M_elems[0].FileDescriptor = 0;
      std::
      __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::reset((__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
               *)&tempOutput,(pointer)__p_00);
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)&builder);
      cmSystemTools::AppendEnv(env);
    }
    iVar6 = Run(&inst,&args,output_local);
    *(int *)&local_3c8->data = iVar6;
    if (output_local == (string *)0x0) {
      psVar10 = (string *)0x0;
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)output_local);
      std::__cxx11::string::~string((string *)&builder);
      psVar10 = output_local;
    }
    if (psVar10 != (string *)0x0 && log_local != (ostream *)0x0) {
      std::operator<<(log_local,(string *)psVar10);
      psVar10 = output_local;
    }
    if (psVar10 != (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder);
      poVar8 = std::operator<<((ostream *)&builder,"Internal cmCTest object used to run test.");
      poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<(poVar8,(string *)output_local);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::stringbuf::str();
      Log(pcVar4,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x4f9,(char *)__tmp._M_unused._0_8_,false);
      std::__cxx11::string::~string((string *)__tmp._M_pod_data);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder);
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&tempOutput);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::~unique_ptr
              (&inst.Impl);
    bVar11 = true;
  }
  else {
    tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (output_local != (string *)0x0) {
      output_local->_M_string_length = 0;
      *(output_local->_M_dataplus)._M_p = '\0';
    }
    saveEnv._M_t.
    super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>,_true,_true>
          )(__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
            )0x0;
    if (bVar11) {
      std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      __p = _cmCTestLog_msg;
      _cmCTestLog_msg = (pointer)0x0;
      std::
      __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::reset((__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
               *)&saveEnv,(pointer)__p);
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)&cmCTestLog_msg);
      cmSystemTools::AppendEnv(environment);
    }
    cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
    this_00 = cmUVProcessChainBuilder::AddCommand(&builder,argv);
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(this_00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Command is: ");
    poVar8 = std::operator<<(poVar8,(string *)
                                    (argv->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x50b,(char *)__tmp._M_unused._0_8_,false);
    std::__cxx11::string::~string((string *)__tmp._M_pod_data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
    cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
    outputStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    outputStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ctx = cmUVProcessChain::GetLoop(&chain);
    ::cm::uv_pipe_ptr::init(&outputStream,(EVP_PKEY_CTX *)ctx);
    handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       (&outputStream.super_uv_handle_ptr_<uv_pipe_s>);
    iVar6 = cmUVProcessChain::OutputStream(&chain);
    uv_pipe_open(handle,iVar6);
    stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&outputStream);
    std::make_unique<cmUVStreamReadHandle>();
    uVar3 = outputHandle;
    _cmCTestLog_msg = (void *)0x0;
    __tmp._M_unused._M_object = operator_new(0x28);
    *(cmCTest **)__tmp._M_unused._0_8_ = this;
    *(cmProcessOutput **)((long)__tmp._M_unused._0_8_ + 8) = &processOutput;
    *(string ***)((long)__tmp._M_unused._0_8_ + 0x10) = &output_local;
    *(vector<char,_std::allocator<char>_> **)((long)__tmp._M_unused._0_8_ + 0x18) = &tempOutput;
    *(ostream ***)((long)__tmp._M_unused._0_8_ + 0x20) = &log_local;
    __tmp._8_8_ = 0;
    _cmCTestLog_msg =
         *(undefined8 *)
          ((long)uVar3._M_t.
                 super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                 .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x18);
    *(undefined8 *)
     ((long)uVar3._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x18) =
         __tmp._M_unused._M_object;
    *(undefined8 *)
     ((long)uVar3._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x20) = 0;
    *(code **)((long)uVar3._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x28) =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5)>
         ::_M_manager;
    *(code **)((long)uVar3._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x30) =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5)>
         ::_M_invoke;
    std::_Function_base::~_Function_base((_Function_base *)&cmCTestLog_msg);
    uVar3 = outputHandle;
    _cmCTestLog_msg = (void *)0x0;
    __tmp._M_unused._M_object = operator_new(0x18);
    *(cmCTest **)__tmp._M_unused._0_8_ = this;
    *(cmProcessOutput **)((long)__tmp._M_unused._0_8_ + 8) = &processOutput;
    *(ostream ***)((long)__tmp._M_unused._0_8_ + 0x10) = &log_local;
    __tmp._8_8_ = 0;
    _cmCTestLog_msg =
         *(undefined8 *)
          ((long)uVar3._M_t.
                 super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                 .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x38);
    *(undefined8 *)
     ((long)uVar3._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x38) =
         __tmp._M_unused._M_object;
    *(undefined8 *)
     ((long)uVar3._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x40) = 0;
    *(code **)((long)uVar3._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x48) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
         ::_M_manager;
    *(code **)((long)uVar3._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x50) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
         ::_M_invoke;
    std::_Function_base::~_Function_base((_Function_base *)&cmCTestLog_msg);
    stream->data = (void *)outputHandle._M_t.
                           super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                           .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl;
    uv_read_start(stream,cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
                         ::anon_class_1_0_00000001::__invoke,
                  cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
                  ::anon_class_1_0_00000001::__invoke);
    uVar9 = (ulong)(local_440.__r * 1000.0);
    bVar11 = cmUVProcessChain::Wait
                       (&chain,(long)(local_440.__r * 1000.0 - 9.223372036854776e+18) &
                               (long)uVar9 >> 0x3f | uVar9);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_340,&tempOutput);
    cmProcessOutput::DecodeText
              (&processOutput,(vector<char,_std::allocator<char>_> *)&local_340,&tempOutput,0);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_340);
    if ((output_local != (string *)0x0) &&
       (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      std::__cxx11::string::append
                ((char *)output_local,
                 (ulong)tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"-- Process completed");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::stringbuf::str();
    Log(local_3c0,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x533,(char *)__tmp._M_unused._0_8_,false);
    std::__cxx11::string::~string((string *)__tmp._M_pod_data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (bVar11) {
      this_01 = cmUVProcessChain::GetStatus(&chain,0);
      cmUVProcessChain::Status::GetException_abi_cxx11_
                ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__tmp,this_01);
      pcVar4 = local_3c0;
      if (__tmp._0_4_ == 0) {
        iVar6 = (int)this_01->ExitStatus;
        *(int *)&local_3c8->data = iVar6;
        bVar11 = true;
        if ((iVar6 != 0) &&
           (((local_3c0->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
            OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(local_3c0,&tempOutput);
        }
      }
      else {
        if (__tmp._0_4_ == 5) {
          cmStrCat<char_const(&)[23],std::__cxx11::string&>
                    ((string *)&args,(char (*) [23])"\n*** ERROR executing: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (__tmp._M_pod_data + 8));
          if (output_local != (string *)0x0) {
            std::__cxx11::string::append((string *)output_local);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&args);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::stringbuf::str();
          Log(pcVar4,5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
              ,0x548,(char *)inst.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,false);
        }
        else {
          if (((local_3c0->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
              OutputTestOutputOnTestFailure == true) {
            OutputTestErrors(local_3c0,&tempOutput);
          }
          *(int *)&local_3c8->data = this_01->TermSignal;
          cmStrCat<char_const(&)[27],std::__cxx11::string&>
                    ((string *)&args,(char (*) [27])"\n*** Exception executing: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (__tmp._M_pod_data + 8));
          if (output_local != (string *)0x0) {
            std::__cxx11::string::append((string *)output_local);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&args);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::stringbuf::str();
          Log(pcVar4,5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
              ,0x554,(char *)inst.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,false);
        }
        std::__cxx11::string::~string((string *)&inst);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&args);
        bVar11 = false;
      }
      std::__cxx11::string::~string((string *)(__tmp._M_pod_data + 8));
    }
    else {
      bVar11 = false;
    }
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              (&outputHandle);
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)&outputStream);
    cmUVProcessChain::~cmUVProcessChain(&chain);
    cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr(&saveEnv);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&tempOutput.super__Vector_base<char,_std::allocator<char>_>);
  }
  return bVar11;
}

Assistant:

bool cmCTest::RunTest(const std::vector<std::string>& argv,
                      std::string* output, int* retVal, std::ostream* log,
                      cmDuration testTimeOut,
                      std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->Impl->TimeOut > cmDuration::zero() &&
      this->Impl->TimeOut < timeout) {
    timeout = this->Impl->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->Impl->ForceNewCTestProcess) {
    cmCTest inst;
    inst.Impl->ConfigType = this->Impl->ConfigType;
    inst.Impl->TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (auto const& i : argv) {
      // make sure we pass the timeout in for any build and test
      // invocations. Since --build-generator is required this is a
      // good place to check for it, and to add the arguments in
      if (i == "--build-generator" && timeout != cmCTest::MaxDuration() &&
          timeout > cmDuration::zero()) {
        args.emplace_back("--test-timeout");
        args.push_back(std::to_string(cmDurationTo<unsigned int>(timeout)));
      }
      args.emplace_back(i);
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return true;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmUVProcessChainBuilder builder;
  builder.AddCommand(argv).SetMergedBuiltinStreams();
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  auto chain = builder.Start();

  cmProcessOutput processOutput(encoding);
  cm::uv_pipe_ptr outputStream;
  outputStream.init(chain.GetLoop(), 0);
  uv_pipe_open(outputStream, chain.OutputStream());
  auto outputHandle = cmUVStreamRead(
    outputStream,
    [this, &processOutput, &output, &tempOutput,
     &log](std::vector<char> data) {
      std::string strdata;
      processOutput.DecodeText(data.data(), data.size(), strdata);
      if (output) {
        cm::append(tempOutput, data.data(), data.data() + data.size());
      }
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 cmCTestLogWrite(strdata.c_str(), strdata.size()));
      if (log) {
        log->write(strdata.c_str(), strdata.size());
      }
    },
    [this, &processOutput, &log]() {
      std::string strdata;
      processOutput.DecodeText(std::string(), strdata);
      if (!strdata.empty()) {
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   cmCTestLogWrite(strdata.c_str(), strdata.size()));
        if (log) {
          log->write(strdata.c_str(), strdata.size());
        }
      }
    });

  bool complete = chain.Wait(static_cast<uint64_t>(timeout.count() * 1000.0));
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  bool result = false;

  if (complete) {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        *retVal = static_cast<int>(status.ExitStatus);
        if (*retVal != 0 && this->Impl->OutputTestOutputOnTestFailure) {
          this->OutputTestErrors(tempOutput);
        }
        result = true;
        break;
      case cmUVProcessChain::ExceptionCode::Spawn: {
        std::string outerr =
          cmStrCat("\n*** ERROR executing: ", exception.second);
        if (output) {
          *output += outerr;
        }
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl);
      } break;
      default: {
        if (this->Impl->OutputTestOutputOnTestFailure) {
          this->OutputTestErrors(tempOutput);
        }
        *retVal = status.TermSignal;
        std::string outerr =
          cmStrCat("\n*** Exception executing: ", exception.second);
        if (output) {
          *output += outerr;
        }
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl);
      } break;
    }
  }

  return result;
}